

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-reach.cc
# Opt level: O0

int parse_command_line(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  runtime_error *prVar3;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_72;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_20;
  int local_1c;
  int c;
  int long_option_index;
  char **argv_local;
  int argc_local;
  
  _c = argv;
  argv_local._4_4_ = argc;
  while( true ) {
    local_1c = -1;
    local_20 = getopt_long(argv_local._4_4_,_c,"a:C:hl:o:s:",long_options,&local_1c);
    if (local_20 == -1) {
      return _optind;
    }
    if (local_20 == 0x3a) break;
    if (local_20 == 0x3f) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Unknown command-line option");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_20 == 0) {
      iVar2 = strcmp(long_options[local_1c].name,"block-size");
      if (iVar2 == 0) {
        block_size = strtoull(_optarg,(char **)0x0,10);
      }
      else {
        iVar2 = strcmp(long_options[local_1c].name,"table-size");
        if (iVar2 != 0) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"This also should never be executed");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        table_size = strtoull(_optarg,(char **)0x0,10);
      }
    }
    else {
      switch(local_20) {
      case 0x43:
        iVar2 = strcmp(_optarg,"none");
        if (iVar2 == 0) {
          certificate = CERTIFICATE_NONE;
        }
        else {
          iVar2 = strcmp(_optarg,"graph");
          if (iVar2 == 0) {
            certificate = CERTIFICATE_GRAPH;
          }
          else {
            iVar2 = strcmp(_optarg,"concrete");
            if (iVar2 == 0) {
              certificate = CERTIFICATE_CONCRETE;
            }
            else {
              iVar2 = strcmp(_optarg,"symbolic");
              if (iVar2 != 0) {
                prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                pcVar1 = _optarg;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_b8,pcVar1,&local_b9);
                std::operator+(&local_98,"Unknown type of certificate: ",&local_b8);
                std::runtime_error::runtime_error(prVar3,(string *)&local_98);
                __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              certificate = CERTIFICATE_SYMBOLIC;
            }
          }
        }
        break;
      default:
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"This should never be executed");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      case 0x61:
        iVar2 = strcmp(_optarg,"reach");
        if (iVar2 == 0) {
          algorithm = ALGO_REACH;
        }
        else {
          iVar2 = strcmp(_optarg,"concur19");
          if (iVar2 == 0) {
            algorithm = ALGO_CONCUR19;
          }
          else {
            iVar2 = strcmp(_optarg,"covreach");
            if (iVar2 != 0) {
              local_72 = 1;
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              pcVar1 = _optarg;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,pcVar1,&local_71);
              std::operator+(&local_50,"Unknown algorithm: ",&local_70);
              std::runtime_error::runtime_error(prVar3,(string *)&local_50);
              local_72 = 0;
              __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            algorithm = ALGO_COVREACH;
          }
        }
        break;
      case 0x68:
        help = true;
        break;
      case 0x6c:
        std::__cxx11::string::operator=((string *)&labels_abi_cxx11_,_optarg);
        break;
      case 0x6f:
        std::__cxx11::string::operator=((string *)&output_file_abi_cxx11_,_optarg);
        break;
      case 0x73:
        std::__cxx11::string::operator=((string *)&search_order_abi_cxx11_,_optarg);
      }
    }
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"Missing option parameter");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int parse_command_line(int argc, char * argv[])
{
  while (true) {
    int long_option_index = -1;
    int c = getopt_long(argc, argv, options, long_options, &long_option_index);

    if (c == -1)
      break;

    if (c == ':')
      throw std::runtime_error("Missing option parameter");
    else if (c == '?')
      throw std::runtime_error("Unknown command-line option");
    else if (c != 0) {
      switch (c) {
      case 'a':
        if (strcmp(optarg, "reach") == 0)
          algorithm = ALGO_REACH;
        else if (strcmp(optarg, "concur19") == 0)
          algorithm = ALGO_CONCUR19;
        else if (strcmp(optarg, "covreach") == 0)
          algorithm = ALGO_COVREACH;
        else
          throw std::runtime_error("Unknown algorithm: " + std::string(optarg));
        break;
      case 'C':
        if (strcmp(optarg, "none") == 0)
          certificate = CERTIFICATE_NONE;
        else if (strcmp(optarg, "graph") == 0)
          certificate = CERTIFICATE_GRAPH;
        else if (strcmp(optarg, "concrete") == 0)
          certificate = CERTIFICATE_CONCRETE;
        else if (strcmp(optarg, "symbolic") == 0)
          certificate = CERTIFICATE_SYMBOLIC;
        else
          throw std::runtime_error("Unknown type of certificate: " + std::string(optarg));
        break;
      case 'o':
        output_file = optarg;
        break;
      case 'h':
        help = true;
        break;
      case 'l':
        labels = optarg;
        break;
      case 's':
        search_order = optarg;
        break;
      default:
        throw std::runtime_error("This should never be executed");
        break;
      }
    }
    else {
      if (strcmp(long_options[long_option_index].name, "block-size") == 0)
        block_size = std::strtoull(optarg, nullptr, 10);
      else if (strcmp(long_options[long_option_index].name, "table-size") == 0)
        table_size = std::strtoull(optarg, nullptr, 10);
      else
        throw std::runtime_error("This also should never be executed");
    }
  }

  return optind;
}